

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Skeleton::Skeleton(Skeleton *this,Mesh *mesh)

{
  _Rb_tree_header *p_Var1;
  Joint *pJVar2;
  Vector3D local_38;
  
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_002748d8;
  (this->idToJoint)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->idToJoint)._M_t._M_impl.super__Rb_tree_header;
  (this->idToJoint)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->joints,0,0x98);
  (this->idToJoint)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->idToJoint)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->idToJoint)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mesh = mesh;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  pJVar2 = createNewJoint(this,(Joint *)0x0,&local_38);
  this->root = pJVar2;
  return;
}

Assistant:

Skeleton::Skeleton(Mesh* mesh) {
    this->mesh = mesh;
    joints.clear();
    root = createNewJoint(nullptr, Vector3D(0, 0, 0));
  }